

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceManager.cpp
# Opt level: O3

Font * __thiscall ResourceManager::getFont(ResourceManager *this,path *filename)

{
  source_loc loc;
  bool bVar1;
  iterator iVar2;
  logger *this_00;
  mapped_type *this_01;
  runtime_error *this_02;
  long *plVar3;
  size_type *psVar4;
  string_view_t fmt;
  string local_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  iVar2 = std::
          _Rb_tree<ghc::filesystem::path,_std::pair<const_ghc::filesystem::path,_sf::Font>,_std::_Select1st<std::pair<const_ghc::filesystem::path,_sf::Font>_>,_std::less<ghc::filesystem::path>,_std::allocator<std::pair<const_ghc::filesystem::path,_sf::Font>_>_>
          ::find(&(this->fonts_)._M_t,filename);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->fonts_)._M_t._M_impl.super__Rb_tree_header) {
    this_00 = spdlog::default_logger_raw();
    local_88._M_dataplus._M_p = (pointer)0x0;
    local_88._M_string_length = 0;
    local_88.field_2._M_allocated_capacity = 0;
    loc.funcname = (char *)0x0;
    loc.filename = (char *)0x0;
    loc.line = 0;
    loc._12_4_ = 0;
    fmt.size_ = 0x20;
    fmt.data_ = "ResourceManager loading font {}.";
    spdlog::logger::log_<ghc::filesystem::path_const&>(this_00,loc,debug,fmt,filename);
    this_01 = std::
              map<ghc::filesystem::path,_sf::Font,_std::less<ghc::filesystem::path>,_std::allocator<std::pair<const_ghc::filesystem::path,_sf::Font>_>_>
              ::operator[](&this->fonts_,filename);
    ghc::filesystem::path::string_abi_cxx11_(&local_88,filename);
    bVar1 = sf::Font::loadFromFile(this_01,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    if (!bVar1) {
      this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
      ghc::filesystem::path::string_abi_cxx11_(&local_68,filename);
      std::operator+(&local_48,"\"",&local_68);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_48);
      local_88._M_dataplus._M_p = (pointer)*plVar3;
      psVar4 = (size_type *)(plVar3 + 2);
      if ((size_type *)local_88._M_dataplus._M_p == psVar4) {
        local_88.field_2._M_allocated_capacity = *psVar4;
        local_88.field_2._8_8_ = plVar3[3];
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      }
      else {
        local_88.field_2._M_allocated_capacity = *psVar4;
      }
      local_88._M_string_length = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::runtime_error::runtime_error(this_02,(string *)&local_88);
      __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    this_01 = (mapped_type *)(iVar2._M_node + 2);
  }
  return this_01;
}

Assistant:

sf::Font& ResourceManager::getFont(const fs::path& filename) {
    auto font = fonts_.find(filename);
    if (font != fonts_.end()) {
        return font->second;
    }
    spdlog::debug("ResourceManager loading font {}.", filename);
    sf::Font& newFont = fonts_[filename];
    if (!newFont.loadFromFile(filename.string())) {
        throw std::runtime_error("\"" + filename.string() + "\": unable to load font file.");
    }
    return newFont;
}